

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Subscription_deleteMonitoredItem
          (UA_Server *server,UA_Subscription *sub,UA_UInt32 monitoredItemID)

{
  UA_MonitoredItem *local_30;
  UA_MonitoredItem *mon;
  UA_UInt32 monitoredItemID_local;
  UA_Subscription *sub_local;
  UA_Server *server_local;
  
  local_30 = (sub->monitoredItems).lh_first;
  while( true ) {
    if (local_30 == (UA_MonitoredItem *)0x0) {
      return 0x80420000;
    }
    if (local_30->itemId == monitoredItemID) break;
    local_30 = (local_30->listEntry).le_next;
  }
  if ((local_30->listEntry).le_next != (UA_MonitoredItem *)0x0) {
    (((local_30->listEntry).le_next)->listEntry).le_prev = (local_30->listEntry).le_prev;
  }
  *(local_30->listEntry).le_prev = (local_30->listEntry).le_next;
  MonitoredItem_delete(server,local_30);
  return 0;
}

Assistant:

UA_StatusCode
UA_Subscription_deleteMonitoredItem(UA_Server *server, UA_Subscription *sub,
                                    UA_UInt32 monitoredItemID) {
    UA_MonitoredItem *mon;
    LIST_FOREACH(mon, &sub->monitoredItems, listEntry) {
        if(mon->itemId == monitoredItemID) {
            LIST_REMOVE(mon, listEntry);
            MonitoredItem_delete(server, mon);
            return UA_STATUSCODE_GOOD;
        }
    }
    return UA_STATUSCODE_BADMONITOREDITEMIDINVALID;
}